

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_Write(PortMidiStream *stream,PmEvent *buffer,int32_t length)

{
  uint uVar1;
  char cVar2;
  undefined4 uVar3;
  undefined1 *puVar4;
  uchar midi_byte;
  uchar *ptr;
  uint32_t msg;
  int bits;
  int i;
  PmError err;
  PmInternal *midi;
  int32_t length_local;
  PmEvent *buffer_local;
  PortMidiStream *stream_local;
  
  pm_hosterror = 0;
  if (stream == (PortMidiStream *)0x0) {
    bits = -0x270b;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    bits = -0x270b;
  }
  else if (descriptors[*stream].pub.output == 0) {
    bits = -0x270b;
  }
  else {
    bits = 0;
  }
  if (bits == 0) {
    if (*(int *)((long)stream + 0x28) == 0) {
      *(undefined4 *)((long)stream + 0x48) = 0;
    }
    else {
      uVar3 = (**(code **)((long)stream + 8))(*(undefined8 *)((long)stream + 0x10));
      *(undefined4 *)((long)stream + 0x48) = uVar3;
      if ((*(int *)((long)stream + 0x4c) != 0) ||
         (*(int *)((long)stream + 0x44) + 100 < *(int *)((long)stream + 0x48))) {
        uVar3 = (**(code **)(*(long *)((long)stream + 0x50) + 0x30))(stream);
        *(undefined4 *)((long)stream + 0x48) = uVar3;
        *(undefined4 *)((long)stream + 0x4c) = 0;
      }
    }
    for (msg = 0; (int)msg < length; msg = msg + 1) {
      uVar1 = buffer[(int)msg].message;
      ptr._4_4_ = 0;
      if ((uVar1 & 0xff) == 0xf0) {
        if (*(int *)((long)stream + 0x2c) != 0) {
          *(undefined4 *)((long)stream + 0x2c) = 0;
          bits = -0x270a;
          goto LAB_001069c7;
        }
        *(undefined4 *)((long)stream + 0x2c) = 1;
        bits = (**(code **)(*(long *)((long)stream + 0x50) + 8))(stream,buffer[(int)msg].timestamp);
        if ((bits != 0) ||
           (bits = (**(code **)(*(long *)((long)stream + 0x50) + 0x18))
                             (stream,0xf0,buffer[(int)msg].timestamp), bits != 0))
        goto LAB_001069c7;
        ptr._4_4_ = 8;
LAB_0010686d:
        if (*(int *)((long)stream + 0x2c) == 0) {
          bits = -0x270a;
          goto LAB_001069c7;
        }
        if ((((ptr._4_4_ == 0) && (*(long *)((long)stream + 0x60) != 0)) &&
            (**(int **)((long)stream + 0x68) + 4U <= *(uint *)((long)stream + 0x70))) &&
           ((uVar1 & 0x80808080) == 0)) {
          puVar4 = (undefined1 *)
                   (*(long *)((long)stream + 0x60) + (ulong)**(uint **)((long)stream + 0x68));
          *puVar4 = (char)uVar1;
          puVar4[1] = (char)(uVar1 >> 8);
          puVar4[2] = (char)(uVar1 >> 0x10);
          puVar4[3] = (char)(uVar1 >> 0x18);
          **(int **)((long)stream + 0x68) = **(int **)((long)stream + 0x68) + 4;
        }
        else {
          for (; ptr._4_4_ < 0x20; ptr._4_4_ = ptr._4_4_ + 8) {
            cVar2 = (char)(uVar1 >> ((byte)ptr._4_4_ & 0x1f));
            bits = (**(code **)(*(long *)((long)stream + 0x50) + 0x18))
                             (stream,cVar2,buffer[(int)msg].timestamp);
            if (bits != 0) goto LAB_001069c7;
            if (cVar2 == -9) {
              bits = pm_end_sysex((PmInternal *)stream);
              if (bits != pmNoData) {
                return bits;
              }
              break;
            }
          }
        }
      }
      else {
        if (((uVar1 & 0x80) == 0) || ((uVar1 & 0xff) == 0xf7)) goto LAB_0010686d;
        if (*(int *)((long)stream + 0x2c) != 0) {
          if ((uVar1 & 0xf8) == 0xf8) {
            bits = (**(code **)(*(long *)((long)stream + 0x50) + 0x20))(stream);
            if (bits == 0) goto LAB_0010686d;
          }
          else {
            *(undefined4 *)((long)stream + 0x2c) = 0;
            bits = -0x270a;
            (**(code **)(*(long *)((long)stream + 0x50) + 0x10))(stream,0);
          }
          goto LAB_001069c7;
        }
        bits = (*(code *)**(undefined8 **)((long)stream + 0x50))(stream);
        if (bits != 0) goto LAB_001069c7;
      }
    }
    if (*(int *)((long)stream + 0x2c) == 0) {
      bits = (**(code **)(*(long *)((long)stream + 0x50) + 0x28))(stream,0);
    }
  }
LAB_001069c7:
  if (bits == -10000) {
    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
    pm_hosterror = 1;
  }
  return bits;
}

Assistant:

PMEXPORT PmError Pm_Write( PortMidiStream *stream, PmEvent *buffer, int32_t length)
{
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;
    int i;
    int bits;
    
    pm_hosterror = FALSE;
    /* arg checking */
    if(midi == NULL)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.output)
        err = pmBadPtr;
    else
        err = pmNoError;
    
    if (err != pmNoError) goto pm_write_error;
    
    if (midi->latency == 0) {
        midi->now = 0;
    } else {
        midi->now = (*(midi->time_proc))(midi->time_info);
        if (midi->first_message || midi->sync_time + 100 /*ms*/ < midi->now) {
            /* time to resync */
            midi->now = (*midi->dictionary->synchronize)(midi);
            midi->first_message = FALSE;
        }
    }
    /* error recovery: when a sysex is detected, we call
     *   dictionary->begin_sysex() followed by calls to
     *   dictionary->write_byte() and dictionary->write_realtime()
     *   until an end-of-sysex is detected, when we call
     *   dictionary->end_sysex(). After an error occurs, 
     *   Pm_Write() continues to call functions. For example,
     *   it will continue to call write_byte() even after
     *   an error sending a sysex message, and end_sysex() will be
     *   called when an EOX or non-real-time status is found.
     * When errors are detected, Pm_Write() returns immediately, 
     *   so it is possible that this will drop data and leave
     *   sysex messages in a partially transmitted state.
     */
    for (i = 0; i < length; i++) {
        uint32_t msg = buffer[i].message;
        bits = 0;
        /* is this a sysex message? */
        if (Pm_MessageStatus(msg) == MIDI_SYSEX) {
            if (midi->sysex_in_progress) {
                /* error: previous sysex was not terminated by EOX */
                midi->sysex_in_progress = FALSE;
                err = pmBadData;
                goto pm_write_error;
            }
            midi->sysex_in_progress = TRUE;
            if ((err = (*midi->dictionary->begin_sysex)(midi, 
                               buffer[i].timestamp)) != pmNoError)
                goto pm_write_error;
            if ((err = (*midi->dictionary->write_byte)(midi, MIDI_SYSEX,
                               buffer[i].timestamp)) != pmNoError) 
                goto pm_write_error;
            bits = 8;
            /* fall through to continue sysex processing */
        } else if ((msg & MIDI_STATUS_MASK) && 
                   (Pm_MessageStatus(msg) != MIDI_EOX)) {
            /* a non-sysex message */
            if (midi->sysex_in_progress) {
                /* this should be a realtime message */
                if (is_real_time(msg)) {
                    if ((err = (*midi->dictionary->write_realtime)(midi, 
                                       &(buffer[i]))) != pmNoError)
                        goto pm_write_error;
                } else {
                    midi->sysex_in_progress = FALSE;
                    err = pmBadData;
                    /* ignore any error from this, because we already have one */
                    /* pass 0 as timestamp -- it's ignored */
                    (*midi->dictionary->end_sysex)(midi, 0);
                    goto pm_write_error;
                }
            } else { /* regular short midi message */
                if ((err = (*midi->dictionary->write_short)(midi, 
                                   &(buffer[i]))) != pmNoError)
                    goto pm_write_error;
                continue;
            }
        }
        if (midi->sysex_in_progress) { /* send sysex bytes until EOX */
            /* see if we can accelerate data transfer */
            if (bits == 0 && midi->fill_base && /* 4 bytes to copy */
                (*midi->fill_offset_ptr) + 4 <= midi->fill_length &&
                (msg & 0x80808080) == 0) { /* all data */
                    /* copy 4 bytes from msg to fill_base + fill_offset */
                    unsigned char *ptr = midi->fill_base + 
                                         *(midi->fill_offset_ptr);
                    ptr[0] = msg; ptr[1] = msg >> 8; 
                    ptr[2] = msg >> 16; ptr[3] = msg >> 24;
                    (*midi->fill_offset_ptr) += 4;
                     continue;
            }
            /* no acceleration, so do byte-by-byte copying */
            while (bits < 32) {
                unsigned char midi_byte = (unsigned char) (msg >> bits);
                if ((err = (*midi->dictionary->write_byte)(midi, midi_byte, 
                                   buffer[i].timestamp)) != pmNoError)
                    goto pm_write_error;
                if (midi_byte == MIDI_EOX) {
                    err = pm_end_sysex(midi);
                    if (err != pmNoError) goto error_exit;
                    break; /* from while loop */
                }
                bits += 8;
            }
        } else {
            /* not in sysex mode, but message did not start with status */
            err = pmBadData;
            goto pm_write_error;
        }
    }
    /* after all messages are processed, send the data */
    if (!midi->sysex_in_progress)
        err = (*midi->dictionary->write_flush)(midi, 0);
pm_write_error:
    if (err == pmHostError) {
        midi->dictionary->host_error(midi, pm_hosterror_text, 
                                     PM_HOST_ERROR_MSG_LEN);
        pm_hosterror = TRUE;
    }
error_exit:
    return pm_errmsg(err);
}